

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QUrl __thiscall QCborValue::toUrl(QCborValue *this,QUrl *defaultValue)

{
  QUrlPrivate *pQVar1;
  long lVar2;
  char *pcVar3;
  QUrl *in_RDX;
  QByteArrayView input;
  
  pQVar1 = defaultValue[1].d;
  if (((pQVar1 == (QUrlPrivate *)0x0) || (*(int *)&defaultValue[2].d != 0x10020)) ||
     ((pQVar1->password).d.d != (Data *)0x2)) {
    QUrl::QUrl((QUrl *)this,in_RDX);
  }
  else {
    lVar2 = (pQVar1->userName).d.size;
    if ((*(byte *)(lVar2 + 0x1c) & 2) == 0) {
      QUrl::QUrl((QUrl *)this);
    }
    else {
      pcVar3 = (char *)(pQVar1->scheme).d.size;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "";
      }
      input.m_data = *(storage_type **)(pcVar3 + *(long *)(lVar2 + 0x10));
      input.m_size = (qsizetype)this;
      QUrl::fromEncoded(input,(int)(pcVar3 + *(long *)(lVar2 + 0x10)) + 8);
    }
  }
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QCborValue::toUrl(const QUrl &defaultValue) const
{
    if (!container || !isUrl() || container->elements.size() != 2)
        return defaultValue;

    Q_ASSERT(n == -1);
    const ByteData *byteData = container->byteData(1);
    if (!byteData)
        return QUrl();  // valid, empty URL

    return QUrl::fromEncoded(byteData->asByteArrayView());
}